

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O2

int __thiscall nite::Batch::init(Batch *this,EVP_PKEY_CTX *ctx)

{
  float fVar1;
  int in_EAX;
  int i;
  GLuint GVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int in_EDX;
  pointer pBVar6;
  Batch *local_78 [2];
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  pointer local_48;
  pointer ppBStack_40;
  pointer local_38;
  float local_30;
  float local_2c;
  
  local_2c = (float)(int)ctx;
  if (-1 < this->objectId) {
    fVar1 = (this->size).x;
    if ((fVar1 == local_2c) && (!NAN(fVar1) && !NAN(local_2c))) {
      fVar1 = (this->size).y;
      if ((fVar1 == (float)in_EDX) && (!NAN(fVar1) && !NAN((float)in_EDX))) {
        return in_EAX;
      }
    }
    unload(this);
  }
  lVar4 = ((long)batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x48;
  pBVar6 = batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    if (pBVar6->empty != false) goto LAB_00189139;
    pBVar6 = pBVar6 + 1;
  }
  local_68._M_p = (pointer)((long)&((BatchT *)local_78)->hash + 0x10);
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_48 = (pointer)0x0;
  ppBStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  local_78[0] = (Batch *)CONCAT71(local_78[0]._1_7_,true);
  std::vector<BatchT,_std::allocator<BatchT>_>::emplace_back<BatchT>(&batches,(BatchT *)local_78);
  BatchT::~BatchT((BatchT *)local_78);
  lVar5 = lVar4;
LAB_00189139:
  pBVar6 = batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
           super__Vector_impl_data._M_start;
  this->objectId = (int)lVar5;
  local_78[0] = this;
  std::vector<nite::Batch*,std::allocator<nite::Batch*>>::emplace_back<nite::Batch*>
            ((vector<nite::Batch*,std::allocator<nite::Batch*>> *)&pBVar6[(int)lVar5].owners,
             (Batch **)local_78);
  batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
  _M_start[this->objectId].empty = false;
  local_30 = (float)in_EDX;
  Vec2::set(&this->size,local_2c,local_30);
  Rect::set(&this->region,0.0,0.0,local_2c,local_30);
  Vec2::set(&this->scale,1.0,1.0);
  (*__glewGenFramebuffers)
            (1,&batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
                super__Vector_impl_data._M_start[this->objectId].framebufferId);
  (*__glewBindFramebuffer)
            (0x8d40,batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
                    super__Vector_impl_data._M_start[this->objectId].framebufferId);
  GVar2 = createTexture((int)ctx,in_EDX);
  batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
  _M_start[this->objectId].textureId = GVar2;
  (*__glewFramebufferTexture2D)(0x8d40,0x8ce0,0xde1,GVar2,0);
  iVar3 = (*__glewBindFramebuffer)(0x8d40,0);
  return iVar3;
}

Assistant:

void nite::Batch::init(int w, int h){
	if(objectId >= 0){
		if(w == size.x && h == size.y){
			return;
		}
		unload();
	}
	objectId = getEmptySlot();
	batches[objectId].owners.push_back(this);
	batches[objectId].empty = false;
	size.set(w, h);
	region.set(0, 0, w, h);
	scale.set(1.0f, 1.0f);
	glGenFramebuffers(1, &batches[objectId].framebufferId);
	glBindFramebuffer(GL_FRAMEBUFFER, batches[objectId].framebufferId);
	batches[objectId].textureId = createTexture(w, h);
	glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, batches[objectId].textureId, 0);
	glBindFramebuffer(GL_FRAMEBUFFER, 0);
}